

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsGetAndClearExceptionWithMetadata(JsValueRef *metadata)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  JsErrorCode exitStatus;
  JsrtContext *pJVar5;
  undefined4 *puVar6;
  JavascriptExceptionObject *this;
  Var newValue;
  Var instance;
  FunctionBody *pFVar7;
  void *unaff_retaddr;
  undefined1 local_c0 [8];
  EnterScriptObject __enterScriptObject;
  AutoHandledExceptionType __autoHandledExceptionType;
  TTDJsRTActionResultAutoRecorder local_58;
  undefined4 local_40;
  AutoNestedHandledExceptionType local_3c;
  ScriptContext *pSStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (metadata == (JsValueRef *)0x0) {
    return JsErrorNullArgument;
  }
  *metadata = (JsValueRef)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    return JsErrorNoCurrentContext;
  }
  pSVar1 = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if (pSVar1 == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                       ,0x45f,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if ((pSVar1->recycler != (Recycler *)0x0) &&
     (bVar3 = Memory::Recycler::IsHeapEnumInProgress(pSVar1->recycler), bVar3)) {
    return JsErrorHeapEnumInProgress;
  }
  if ((pSVar1->threadContext->threadService).isInCallback != false) {
    return JsErrorInThreadServiceCallback;
  }
  bVar3 = ThreadContext::IsExecutionDisabled(pSVar1->threadContext);
  if (bVar3) {
    return JsErrorInDisabledState;
  }
  AutoHandledExceptionType::AutoHandledExceptionType
            ((AutoHandledExceptionType *)&__enterScriptObject.library,ExceptionType_OutOfMemory);
  bVar3 = Js::ScriptContext::HasRecordedException(pSVar1);
  if (bVar3) {
    this = Js::ScriptContext::GetAndClearRecordedException(pSVar1,(bool *)0x0);
  }
  else {
    this = (JavascriptExceptionObject *)0x0;
  }
  AutoHandledExceptionType::~AutoHandledExceptionType
            ((AutoHandledExceptionType *)&__enterScriptObject.library);
  if (this == (JavascriptExceptionObject *)0x0) {
    return JsErrorInvalidArgument;
  }
  newValue = Js::JavascriptExceptionObject::GetThrownObject(this,(ScriptContext *)0x0);
  if (newValue == (Var)0x0) {
    return JsErrorInvalidArgument;
  }
  local_40 = 0;
  local_58.m_actionEvent = (EventLogEntry *)0x0;
  local_58.m_resultPtr = (TTDVar *)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  exitStatus = CheckContext(pJVar5,false,false);
  if (exitStatus != JsNoError) goto LAB_003b6ef8;
  pSVar1 = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  pSStack_38 = pSVar1;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_3c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_c0,pSVar1,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             true,true,true);
  Js::ScriptContext::OnScriptStart(pSVar1,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_c0);
  instance = Js::JavascriptExceptionMetadata::CreateMetadataVar(pSStack_38);
  Js::JavascriptOperators::OP_SetProperty
            (instance,0x2d4,newValue,pSStack_38,(PropertyValueInfo *)0x0,PropertyOperation_None,
             (Var)0x0);
  pFVar7 = Js::JavascriptExceptionObject::GetFunctionBody(this);
  if (pFVar7 == (FunctionBody *)0x0) {
    Js::JavascriptExceptionMetadata::PopulateMetadataFromCompileException
              (instance,newValue,pSStack_38);
LAB_003b6e98:
    *metadata = instance;
    exitStatus = JsNoError;
    if ((char)local_40 == '\0') {
      bVar4 = pSStack_38->TTDShouldPerformRecordAction;
      if ((bool)bVar4 == true) {
        TTD::EventLog::RecordJsRTGetAndClearExceptionWithMetadata
                  (pSStack_38->threadContext->TTDLog,&local_58);
        bVar4 = pSStack_38->TTDShouldPerformRecordAction;
      }
      if ((bVar4 & 1) != 0) {
        TTD::TTDJsRTActionResultAutoRecorder::SetResult(&local_58,metadata);
        exitStatus = JsNoError;
      }
    }
  }
  else {
    bVar3 = Js::JavascriptExceptionMetadata::PopulateMetadataFromException(instance,this,pSStack_38)
    ;
    exitStatus = JsErrorInvalidArgument;
    if (bVar3) goto LAB_003b6e98;
  }
  Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_c0);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
LAB_003b6ef8:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode(&local_58,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsGetAndClearExceptionWithMetadata(_Out_ JsValueRef *metadata)
{
    PARAM_NOT_NULL(metadata);
    *metadata = nullptr;

    JsrtContext *currentContext = JsrtContext::GetCurrent();

    if (currentContext == nullptr)
    {
        return JsErrorNoCurrentContext;
    }

    Js::ScriptContext *scriptContext = currentContext->GetScriptContext();
    Assert(scriptContext != nullptr);

    if (scriptContext->GetRecycler() && scriptContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (scriptContext->GetThreadContext()->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    if (scriptContext->GetThreadContext()->IsExecutionDisabled())
    {
        return JsErrorInDisabledState;
    }

    HRESULT hr = S_OK;
    Js::JavascriptExceptionObject *recordedException = nullptr;

    BEGIN_TRANSLATE_OOM_TO_HRESULT
        if (scriptContext->HasRecordedException())
        {
            recordedException = scriptContext->GetAndClearRecordedException();
        }
    END_TRANSLATE_OOM_TO_HRESULT(hr)

        if (hr == E_OUTOFMEMORY)
        {
            recordedException = scriptContext->GetThreadContext()->GetRecordedException();
        }
    if (recordedException == nullptr)
    {
        return JsErrorInvalidArgument;
    }

    Js::Var exception = recordedException->GetThrownObject(nullptr);

    if (exception == nullptr)
    {
        // TODO: How does this early bailout impact TTD?
        return JsErrorInvalidArgument;
    }

    return ContextAPIWrapper<false>([&](Js::ScriptContext* scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        Js::Var exceptionMetadata = Js::JavascriptExceptionMetadata::CreateMetadataVar(scriptContext);
        Js::JavascriptOperators::OP_SetProperty(exceptionMetadata, Js::PropertyIds::exception, exception, scriptContext);

        Js::FunctionBody *functionBody = recordedException->GetFunctionBody();
        if (functionBody == nullptr)
        {
            // This is probably a parse error. We can get the error location metadata from the thrown object.
            Js::JavascriptExceptionMetadata::PopulateMetadataFromCompileException(exceptionMetadata, exception, scriptContext);
        }
        else
        {
            if (!Js::JavascriptExceptionMetadata::PopulateMetadataFromException(exceptionMetadata, recordedException, scriptContext))
            {
                return JsErrorInvalidArgument;
            }
        }

        *metadata = exceptionMetadata;

#if ENABLE_TTD
        if (hr != E_OUTOFMEMORY)
        {
            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTGetAndClearExceptionWithMetadata);
            PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, metadata);
        }
#endif


        return JsNoError;
    });
}